

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_bzip2.c
# Opt level: O2

int bzip2_reader_init(archive_read_filter *self)

{
  int iVar1;
  
  iVar1 = __archive_read_program(self,"bzip2 -d");
  self->code = 2;
  self->name = "bzip2";
  return iVar1;
}

Assistant:

static int
bzip2_reader_init(struct archive_read_filter *self)
{
	int r;

	r = __archive_read_program(self, "bzip2 -d");
	/* Note: We set the format here even if __archive_read_program()
	 * above fails.  We do, after all, know what the format is
	 * even if we weren't able to read it. */
	self->code = ARCHIVE_FILTER_BZIP2;
	self->name = "bzip2";
	return (r);
}